

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AST.h
# Opt level: O0

void __thiscall
soul::AST::Scope::NameSearch::
addFirstMatching<std::vector<soul::pool_ref<soul::AST::UsingDeclaration>,std::allocator<soul::pool_ref<soul::AST::UsingDeclaration>>>>
          (NameSearch *this,
          vector<soul::pool_ref<soul::AST::UsingDeclaration>,_std::allocator<soul::pool_ref<soul::AST::UsingDeclaration>_>_>
          *array)

{
  Identifier targetName;
  vector<soul::pool_ref<soul::AST::UsingDeclaration>,_std::allocator<soul::pool_ref<soul::AST::UsingDeclaration>_>_>
  *array_local;
  NameSearch *this_local;
  
  targetName = IdentifierPath::getLastPart(&this->partiallyQualifiedPath);
  addFirstWithName<std::vector<soul::pool_ref<soul::AST::UsingDeclaration>,std::allocator<soul::pool_ref<soul::AST::UsingDeclaration>>>>
            (this,array,targetName);
  return;
}

Assistant:

void addFirstMatching (const ArrayType& array)
            {
                addFirstWithName (array, partiallyQualifiedPath.getLastPart());
            }